

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O1

void __thiscall
PartiallySignedTransaction::Unserialize<DataStream>(PartiallySignedTransaction *this,DataStream *s)

{
  map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  *this_00;
  undefined1 auVar1 [16];
  long lVar2;
  uint uVar3;
  long lVar4;
  void *pvVar5;
  pointer puVar6;
  pointer puVar7;
  bool bVar8;
  bool bVar9;
  uint64_t uVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
  *p_Var13;
  const_iterator cVar14;
  const_iterator cVar15;
  _Optional_payload_base<unsigned_int> _Var16;
  ulong uVar17;
  char *pcVar18;
  size_t in_RCX;
  _Optional_payload_base<unsigned_int> __args_1;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  CExtPubKey *pCVar22;
  pointer puVar23;
  CExtPubKey *pCVar24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  long in_FS_OFFSET;
  byte bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  pair<std::_Rb_tree_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar29;
  SpanReader skey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  KeyOriginInfo keypath;
  uint8_t magic [5];
  CExtPubKey xpub;
  uint32_t v;
  set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> global_xpubs;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  key_lookup;
  SpanReader local_488;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_478;
  undefined1 local_460 [8];
  undefined1 local_458 [16];
  pointer local_448;
  int local_43d;
  char local_439;
  undefined1 local_438 [24];
  undefined1 auStack_420 [8];
  undefined1 local_418 [24];
  undefined1 auStack_400 [16];
  char local_3f0 [8];
  _Base_ptr local_3e8;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  local_390;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_360;
  _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
  local_330 [11];
  TransactionSerParams *local_110;
  CExtPubKey *local_108;
  uchar local_a0;
  _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
  local_98;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_68;
  long local_38;
  
  bVar26 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::read(s,(int)&local_43d,(void *)0x5,in_RCX);
  if (local_439 == -1 && local_43d == 0x74627370) {
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    __args_1._M_payload = (_Storage<unsigned_int,_true>)0x0;
    __args_1._M_engaged = false;
    __args_1._5_3_ = 0;
    bVar9 = false;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->m_xpubs;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if ((long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start == s->m_read_pos) break;
      local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      DataStream::operator>>(s,&local_478);
      puVar6 = local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar9 = true;
      }
      else {
        local_488.m_data.m_size =
             (long)local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_488.m_data.m_data =
             local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        uVar10 = ReadCompactSize<SpanReader>(&local_488,true);
        if ((long)uVar10 < 0xfb) {
          if (uVar10 == 0) {
            pVar29 = std::
                     _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                     ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                               ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                                 *)&local_68,&local_478);
            if (((undefined1  [16])pVar29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              pcVar18 = (char *)__cxa_allocate_exception(0x20);
              local_438._8_8_ = std::iostream_category();
              local_438[0] = '\x01';
              local_438[1] = '\0';
              local_438[2] = '\0';
              local_438[3] = '\0';
              std::ios_base::failure[abi:cxx11]::failure
                        (pcVar18,(error_code *)"Duplicate Key, unsigned tx already provided");
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                            std::ios_base::failure[abi:cxx11]::~failure);
              }
              goto LAB_00372201;
            }
            if ((long)local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != 1) {
              pcVar18 = (char *)__cxa_allocate_exception(0x20);
              local_438._8_8_ = std::iostream_category();
              local_438[0] = '\x01';
              local_438[1] = '\0';
              local_438[2] = '\0';
              local_438[3] = '\0';
              std::ios_base::failure[abi:cxx11]::failure
                        (pcVar18,(error_code *)"Global unsigned tx key is more than one byte type");
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                            std::ios_base::failure[abi:cxx11]::~failure);
              }
              goto LAB_00372201;
            }
            CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_438);
            local_110 = &TX_NO_WITNESS;
            local_108 = (CExtPubKey *)local_438;
            UnserializeFromVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction>>
                      (s,(ParamsWrapper<TransactionSerParams,_CMutableTransaction> *)&local_110);
            std::optional<CMutableTransaction>::operator=
                      (&this->tx,(CMutableTransaction *)local_438);
            __args_1 = *(_Optional_payload_base<unsigned_int> *)
                        ((long)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                                _M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin + 8);
            for (_Var16 = *(_Optional_payload_base<unsigned_int> *)
                           &(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                            _M_payload.
                            super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                            super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                            vin; _Var16 != __args_1;
                _Var16 = (_Optional_payload_base<unsigned_int>)((long)_Var16 + 0x68)) {
              uVar21 = *(size_type *)((long)_Var16 + 0x44);
              uVar3 = uVar21 - 0x1d;
              if (uVar21 < 0x1d) {
                uVar3 = uVar21;
              }
              if ((uVar3 != 0) ||
                 (*(pointer *)&((CScriptWitness *)((long)_Var16 + 0x50))->stack !=
                  *(pointer *)((long)_Var16 + 0x58))) {
                pcVar18 = (char *)__cxa_allocate_exception(0x20);
                local_108 = (CExtPubKey *)std::iostream_category();
                local_110 = (TransactionSerParams *)CONCAT44(local_110._4_4_,1);
                std::ios_base::failure[abi:cxx11]::failure
                          (pcVar18,(error_code *)
                                   "Unsigned tx does not have empty scriptSigs and scriptWitnesses."
                          );
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                              std::ios_base::failure[abi:cxx11]::~failure);
                }
                goto LAB_00372201;
              }
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)auStack_420);
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_438);
          }
          else {
            if (uVar10 == 1) {
              if ((long)local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != 0x4f) {
                pcVar18 = (char *)__cxa_allocate_exception(0x20);
                local_438._8_8_ = std::iostream_category();
                local_438[0] = '\x01';
                local_438[1] = '\0';
                local_438[2] = '\0';
                local_438[3] = '\0';
                std::ios_base::failure[abi:cxx11]::failure
                          (pcVar18,(error_code *)
                                   "Size of key was not the expected size for the type global xpub")
                ;
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                              std::ios_base::failure[abi:cxx11]::~failure);
                }
                goto LAB_00372201;
              }
              local_418._0_8_ = (pointer)0x0;
              local_418._8_8_ = (pointer)0x0;
              local_438._16_8_ = (pointer)0x0;
              auStack_420[0] = '\0';
              auStack_420[1] = '\0';
              auStack_420[2] = '\0';
              auStack_420[3] = '\0';
              auStack_420._4_4_ = 0;
              local_418[0x10] = 0xff;
              CExtPubKey::DecodeWithVersion
                        ((CExtPubKey *)local_438,
                         local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
              bVar8 = CPubKey::IsFullyValid((CPubKey *)(local_418 + 0x10));
              if (!bVar8) {
                pcVar18 = (char *)__cxa_allocate_exception(0x20);
                local_108 = (CExtPubKey *)std::iostream_category();
                local_110 = (TransactionSerParams *)CONCAT44(local_110._4_4_,1);
                std::ios_base::failure[abi:cxx11]::failure(pcVar18,(error_code *)"Invalid pubkey");
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                              std::ios_base::failure[abi:cxx11]::~failure);
                }
                goto LAB_00372201;
              }
              cVar11 = std::
                       _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
                       ::find(&local_98,(CExtPubKey *)local_438);
              __args_1 = (_Optional_payload_base<unsigned_int>)
                         &local_98._M_impl.super__Rb_tree_header;
              if ((_Optional_payload_base<unsigned_int>)cVar11._M_node != __args_1) {
                pcVar18 = (char *)__cxa_allocate_exception(0x20);
                local_108 = (CExtPubKey *)std::iostream_category();
                local_110 = (TransactionSerParams *)CONCAT44(local_110._4_4_,1);
                std::ios_base::failure[abi:cxx11]::failure
                          (pcVar18,(error_code *)"Duplicate key, global xpub already provided");
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                              std::ios_base::failure[abi:cxx11]::~failure);
                }
                goto LAB_00372201;
              }
              std::
              _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
              ::_M_insert_unique<CExtPubKey_const&>
                        ((_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                          *)&local_98,(CExtPubKey *)local_438);
              local_458 = (undefined1  [16])0x0;
              local_448 = (pointer)0x0;
              DeserializeHDKeypath<DataStream>(s,(KeyOriginInfo *)local_460);
              cVar12 = std::
                       _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                       ::find(&this_00->_M_t,(key_type *)local_460);
              if ((_Rb_tree_header *)cVar12._M_node ==
                  &(this->m_xpubs)._M_t._M_impl.super__Rb_tree_header) {
                __args_1._M_payload = (_Storage<unsigned_int,_true>)0x1c;
                __args_1._M_engaged = false;
                __args_1._5_3_ = 0;
                pCVar22 = (CExtPubKey *)local_438;
                pCVar24 = (CExtPubKey *)&local_110;
                for (; __args_1 != (_Optional_payload_base<unsigned_int>)0x0;
                    __args_1 = (_Optional_payload_base<unsigned_int>)((long)__args_1 + -1)) {
                  *(undefined4 *)pCVar24->version = *(undefined4 *)pCVar22->version;
                  pCVar22 = (CExtPubKey *)((long)pCVar22 + (ulong)bVar26 * -8 + 4);
                  pCVar24 = (CExtPubKey *)((long)pCVar24 + (ulong)bVar26 * -8 + 4);
                }
                local_a0 = local_3d0[8];
                p_Var13 = (_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                           *)std::
                             map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                             ::operator[](this_00,(key_type *)local_460);
                std::
                _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                ::_M_assign_unique<CExtPubKey_const*>
                          (p_Var13,(CExtPubKey *)&local_110,(CExtPubKey *)&stack0xffffffffffffff64);
              }
              else {
                p_Var13 = (_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                           *)std::
                             map<KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
                             ::operator[](this_00,(key_type *)local_460);
                std::
                _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                ::_M_insert_unique<CExtPubKey_const&>(p_Var13,(CExtPubKey *)local_438);
              }
              p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._0_8_;
              puVar23 = local_448;
            }
            else {
LAB_003712c9:
              cVar15 = std::
                       _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                       ::find(&(this->unknown)._M_t,&local_478);
              if ((_Rb_tree_header *)cVar15._M_node !=
                  &(this->unknown)._M_t._M_impl.super__Rb_tree_header) {
                pcVar18 = (char *)__cxa_allocate_exception(0x20);
                local_438._8_8_ = std::iostream_category();
                local_438[0] = '\x01';
                local_438[1] = '\0';
                local_438[2] = '\0';
                local_438[3] = '\0';
                std::ios_base::failure[abi:cxx11]::failure
                          (pcVar18,(error_code *)
                                   "Duplicate Key, key for unknown value already provided");
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                              std::ios_base::failure[abi:cxx11]::~failure);
                }
                goto LAB_00372201;
              }
              local_438[0] = '\0';
              local_438[1] = '\0';
              local_438[2] = '\0';
              local_438[3] = '\0';
              local_438[4] = '\0';
              local_438[5] = '\0';
              local_438[6] = '\0';
              local_438[7] = '\0';
              local_438._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_438._16_8_ = (pointer)0x0;
              DataStream::operator>>
                        (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_438);
              std::
              _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              ::
              _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        ((pair<std::_Rb_tree_iterator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_bool>
                          *)&this->unknown,
                         (_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                          *)&local_478,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_438,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__args_1);
              p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        CONCAT44(local_438._4_4_,local_438._0_4_);
              puVar23 = (pointer)local_438._16_8_;
            }
            if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0037148b:
              operator_delete(p_Var25,(long)puVar23 - (long)p_Var25);
            }
          }
        }
        else if (uVar10 == 0xfb) {
          if ((this->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged == true) {
            pcVar18 = (char *)__cxa_allocate_exception(0x20);
            local_438._8_8_ = std::iostream_category();
            local_438[0] = '\x01';
            local_438[1] = '\0';
            local_438[2] = '\0';
            local_438[3] = '\0';
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar18,(error_code *)"Duplicate Key, version already provided");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00372201;
          }
          if ((long)local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != 1) {
            pcVar18 = (char *)__cxa_allocate_exception(0x20);
            local_438._8_8_ = std::iostream_category();
            local_438[0] = '\x01';
            local_438[1] = '\0';
            local_438[2] = '\0';
            local_438[3] = '\0';
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar18,(error_code *)"Global version key is more than one byte type");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00372201;
          }
          UnserializeFromVector<DataStream,unsigned_int&>(s,(uint *)&local_110);
          __args_1 = (_Optional_payload_base<unsigned_int>)
                     ((ulong)local_110 & 0xffffffff | 0x100000000);
          (this->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int> = __args_1;
          if (((ulong)local_110 & 0xffffffff) != 0) {
            pcVar18 = (char *)__cxa_allocate_exception(0x20);
            local_438._8_8_ = std::iostream_category();
            local_438[0] = '\x01';
            local_438[1] = '\0';
            local_438[2] = '\0';
            local_438[3] = '\0';
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar18,(error_code *)"Unsupported version number");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00372201;
          }
        }
        else {
          if (uVar10 != 0xfc) goto LAB_003712c9;
          auStack_400[0] = '\0';
          auStack_400[1] = '\0';
          auStack_400[2] = '\0';
          auStack_400[3] = '\0';
          auStack_400._4_4_ = 0;
          auStack_400._8_8_ = (pointer)0x0;
          local_418._8_8_ = (pointer)0x0;
          local_418[0x10] = '\0';
          local_418[0x11] = '\0';
          local_418[0x12] = '\0';
          local_418[0x13] = '\0';
          local_418[0x14] = '\0';
          local_418[0x15] = '\0';
          local_418[0x16] = '\0';
          local_418[0x17] = '\0';
          auStack_420[0] = '\0';
          auStack_420[1] = '\0';
          auStack_420[2] = '\0';
          auStack_420[3] = '\0';
          auStack_420._4_4_ = 0;
          local_418._0_8_ = (pointer)0x0;
          local_438._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_438._16_8_ = (pointer)0x0;
          local_3f0 = (char  [8])0x0;
          SpanReader::operator>>
                    (&local_488,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_438 + 8));
          uVar10 = ReadCompactSize<SpanReader>(&local_488,true);
          local_438._0_4_ = (undefined4)uVar10;
          local_438._4_4_ = (undefined4)(uVar10 >> 0x20);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_418,&local_478);
          cVar14 = std::
                   _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
                   ::find(&(this->m_proprietary)._M_t,(key_type *)local_438);
          if ((_Rb_tree_header *)cVar14._M_node !=
              &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header) {
            pcVar18 = (char *)__cxa_allocate_exception(0x20);
            local_108 = (CExtPubKey *)std::iostream_category();
            local_110 = (TransactionSerParams *)CONCAT44(local_110._4_4_,1);
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar18,(error_code *)"Duplicate Key, proprietary key already found");
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
            goto LAB_00372201;
          }
          DataStream::operator>>
                    (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_400);
          std::
          _Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
          ::_M_insert_unique<PSBTProprietary_const&>
                    ((_Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
                      *)&this->m_proprietary,(PSBTProprietary *)local_438);
          pvVar5 = (void *)CONCAT44(auStack_400._4_4_,auStack_400._0_4_);
          if (pvVar5 != (void *)0x0) {
            operator_delete(pvVar5,(long)local_3f0 - (long)pvVar5);
          }
          if ((pointer)local_418._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_418._0_8_,
                            CONCAT71(local_418._17_7_,local_418[0x10]) - local_418._0_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            puVar23 = (pointer)CONCAT44(auStack_420._4_4_,auStack_420._0_4_);
            p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_438._8_8_;
            goto LAB_0037148b;
          }
        }
      }
      if (local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_478.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_478.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_478.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while (puVar6 != puVar7);
    if (bVar9) {
      if ((this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
          super__Optional_payload<CMutableTransaction,_true,_false,_false>.
          super__Optional_payload_base<CMutableTransaction>._M_engaged == true) {
        if ((long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_start != s->m_read_pos) {
          uVar21 = 0;
          do {
            uVar20 = (ulong)uVar21;
            uVar17 = ((long)*(pointer *)
                             ((long)&(this->tx).
                                     super__Optional_base<CMutableTransaction,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                     .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                     _M_value.vin + 8) -
                      *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                                _M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin >> 3) * 0x4ec4ec4ec4ec4ec5;
            if (uVar17 < uVar20 || uVar17 - uVar20 == 0) break;
            PSBTInput::PSBTInput((PSBTInput *)local_438);
            PSBTInput::Unserialize<DataStream>((PSBTInput *)local_438,s);
            std::vector<PSBTInput,_std::allocator<PSBTInput>_>::push_back
                      (&this->inputs,(PSBTInput *)local_438);
            lVar4 = CONCAT44(local_438._4_4_,local_438._0_4_);
            if (lVar4 != 0) {
              lVar2 = *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                                _M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin;
              lVar19 = uVar20 * 0x68;
              auVar1 = *(undefined1 (*) [16])(lVar4 + 0x49);
              pcVar18 = (char *)(lVar2 + lVar19);
              auVar28[0] = -(*pcVar18 == *(char *)(lVar4 + 0x39));
              auVar28[1] = -(pcVar18[1] == *(char *)(lVar4 + 0x3a));
              auVar28[2] = -(pcVar18[2] == *(char *)(lVar4 + 0x3b));
              auVar28[3] = -(pcVar18[3] == *(char *)(lVar4 + 0x3c));
              auVar28[4] = -(pcVar18[4] == *(char *)(lVar4 + 0x3d));
              auVar28[5] = -(pcVar18[5] == *(char *)(lVar4 + 0x3e));
              auVar28[6] = -(pcVar18[6] == *(char *)(lVar4 + 0x3f));
              auVar28[7] = -(pcVar18[7] == *(char *)(lVar4 + 0x40));
              auVar28[8] = -(pcVar18[8] == *(char *)(lVar4 + 0x41));
              auVar28[9] = -(pcVar18[9] == *(char *)(lVar4 + 0x42));
              auVar28[10] = -(pcVar18[10] == *(char *)(lVar4 + 0x43));
              auVar28[0xb] = -(pcVar18[0xb] == *(char *)(lVar4 + 0x44));
              auVar28[0xc] = -(pcVar18[0xc] == *(char *)(lVar4 + 0x45));
              auVar28[0xd] = -(pcVar18[0xd] == *(char *)(lVar4 + 0x46));
              auVar28[0xe] = -(pcVar18[0xe] == *(char *)(lVar4 + 0x47));
              auVar28[0xf] = -(pcVar18[0xf] == *(char *)(lVar4 + 0x48));
              pcVar18 = (char *)(lVar2 + 0x10 + lVar19);
              auVar27[0] = -(*pcVar18 == auVar1[0]);
              auVar27[1] = -(pcVar18[1] == auVar1[1]);
              auVar27[2] = -(pcVar18[2] == auVar1[2]);
              auVar27[3] = -(pcVar18[3] == auVar1[3]);
              auVar27[4] = -(pcVar18[4] == auVar1[4]);
              auVar27[5] = -(pcVar18[5] == auVar1[5]);
              auVar27[6] = -(pcVar18[6] == auVar1[6]);
              auVar27[7] = -(pcVar18[7] == auVar1[7]);
              auVar27[8] = -(pcVar18[8] == auVar1[8]);
              auVar27[9] = -(pcVar18[9] == auVar1[9]);
              auVar27[10] = -(pcVar18[10] == auVar1[10]);
              auVar27[0xb] = -(pcVar18[0xb] == auVar1[0xb]);
              auVar27[0xc] = -(pcVar18[0xc] == auVar1[0xc]);
              auVar27[0xd] = -(pcVar18[0xd] == auVar1[0xd]);
              auVar27[0xe] = -(pcVar18[0xe] == auVar1[0xe]);
              auVar27[0xf] = -(pcVar18[0xf] == auVar1[0xf]);
              auVar27 = auVar27 & auVar28;
              if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff) {
                pcVar18 = (char *)__cxa_allocate_exception(0x20);
                local_108 = (CExtPubKey *)std::iostream_category();
                local_110 = (TransactionSerParams *)CONCAT44(local_110._4_4_,1);
                std::ios_base::failure[abi:cxx11]::failure
                          (pcVar18,(error_code *)"Non-witness UTXO does not match outpoint hash");
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                              std::ios_base::failure[abi:cxx11]::~failure);
                }
                goto LAB_00372201;
              }
              uVar17 = (ulong)*(uint *)(lVar2 + lVar19 + 0x20);
              uVar20 = (*(long *)(lVar4 + 0x20) - *(long *)(lVar4 + 0x18) >> 3) *
                       -0x3333333333333333;
              if (uVar20 < uVar17 || uVar20 - uVar17 == 0) {
                pcVar18 = (char *)__cxa_allocate_exception(0x20);
                local_108 = (CExtPubKey *)std::iostream_category();
                local_110 = (TransactionSerParams *)CONCAT44(local_110._4_4_,1);
                std::ios_base::failure[abi:cxx11]::failure
                          (pcVar18,(error_code *)"Input specifies output index that does not exist")
                ;
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                              std::ios_base::failure[abi:cxx11]::~failure);
                }
                goto LAB_00372201;
              }
            }
            uVar21 = uVar21 + 1;
            PSBTInput::~PSBTInput((PSBTInput *)local_438);
          } while ((long)(s->vch).
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(s->vch).
                         super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                         _M_impl.super__Vector_impl_data._M_start != s->m_read_pos);
        }
        if (((long)(this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5) * -0x70a3d70a3d70a3d7 +
            ((long)*(pointer *)
                    ((long)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                            _M_payload.
                            super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                            super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                            vin + 8) -
             *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                       .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                       super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin >>
            3) * -0x4ec4ec4ec4ec4ec5 == 0) {
          if ((long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                    _M_impl.super__Vector_impl_data._M_start != s->m_read_pos) {
            uVar17 = 0;
            do {
              uVar20 = ((long)*(pointer *)
                               ((long)&(this->tx).
                                       super__Optional_base<CMutableTransaction,_false,_false>.
                                       _M_payload.
                                       super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                       .super__Optional_payload_base<CMutableTransaction>._M_payload
                                       ._M_value.vout + 8) -
                        *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                  super__Optional_payload_base<CMutableTransaction>._M_payload.
                                  _M_value.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                       >> 3) * -0x3333333333333333;
              if (uVar20 < uVar17 || uVar20 - uVar17 == 0) break;
              local_3f0 = (char  [8])((ulong)local_3f0 & 0xffffffff00000000);
              local_3e8 = (_Base_ptr)0x0;
              local_438[0] = '\0';
              local_438[1] = '\0';
              local_438[2] = '\0';
              local_438[3] = '\0';
              local_438[4] = '\0';
              local_438[5] = '\0';
              local_438[6] = '\0';
              local_438[7] = '\0';
              local_438._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_438._16_8_ = (pointer)0x0;
              auStack_420[0] = '\0';
              auStack_420[1] = '\0';
              auStack_420[2] = '\0';
              auStack_420[3] = '\0';
              auStack_420._4_4_ = 0;
              local_418._0_8_ = (pointer)0x0;
              local_418._8_8_ = (pointer)0x0;
              local_418[0x10] = '\0';
              local_418[0x11] = '\0';
              local_418[0x12] = '\0';
              local_418[0x13] = '\0';
              local_418[0x14] = '\0';
              local_418[0x15] = '\0';
              local_418[0x16] = '\0';
              local_418[0x17] = '\0';
              auStack_400[0] = '\0';
              auStack_400[1] = '\0';
              auStack_400[2] = '\0';
              auStack_400[3] = '\0';
              auStack_400._4_4_ = 0;
              local_390._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_390._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_3a0 = (undefined1  [16])0x0;
              local_3b0 = (undefined1  [16])0x0;
              local_3c0 = (undefined1  [16])0x0;
              local_3d0 = (undefined1  [16])0x0;
              local_390._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_390._M_impl.super__Rb_tree_header._M_header;
              local_390._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_360._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_360._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_360._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_360._M_impl.super__Rb_tree_header._M_header;
              local_360._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_330[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_330[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_330[0]._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_330[0]._M_impl.super__Rb_tree_header._M_header;
              local_330[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_3e0._0_8_ = local_3f0;
              local_3e0._8_8_ = local_3f0;
              local_390._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_390._M_impl.super__Rb_tree_header._M_header._M_left;
              local_360._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_360._M_impl.super__Rb_tree_header._M_header._M_left;
              local_330[0]._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_330[0]._M_impl.super__Rb_tree_header._M_header._M_left;
              PSBTOutput::Unserialize<DataStream>((PSBTOutput *)local_438,s);
              std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::push_back
                        (&this->outputs,(PSBTOutput *)local_438);
              std::
              _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
              ::~_Rb_tree(local_330);
              std::
              _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::~_Rb_tree(&local_360);
              std::
              _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
              ::~_Rb_tree(&local_390);
              std::
              vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::~vector((vector<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                         *)(local_3b0 + 8));
              std::
              _Rb_tree<CPubKey,_std::pair<const_CPubKey,_KeyOriginInfo>,_std::_Select1st<std::pair<const_CPubKey,_KeyOriginInfo>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
              ::~_Rb_tree((_Rb_tree<CPubKey,_std::pair<const_CPubKey,_KeyOriginInfo>,_std::_Select1st<std::pair<const_CPubKey,_KeyOriginInfo>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
                           *)(auStack_400 + 8));
              if (0x1c < (uint)auStack_400._4_4_) {
                free((void *)local_418._0_8_);
                local_418._0_8_ = (pointer)0x0;
              }
              if (0x1c < (uint)auStack_420._4_4_) {
                free((void *)CONCAT44(local_438._4_4_,local_438._0_4_));
                local_438[0] = '\0';
                local_438[1] = '\0';
                local_438[2] = '\0';
                local_438[3] = '\0';
                local_438[4] = '\0';
                local_438[5] = '\0';
                local_438[6] = '\0';
                local_438[7] = '\0';
              }
              uVar17 = (ulong)((int)uVar17 + 1);
            } while ((long)(s->vch).
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(s->vch).
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start != s->m_read_pos);
          }
          if (((long)(this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6f96f96f96f96f97 +
              ((long)*(pointer *)
                      ((long)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                              _M_payload.
                              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                              vout + 8) -
               *(long *)&(this->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                         _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>
                         .super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout
                         .super__Vector_base<CTxOut,_std::allocator<CTxOut>_> >> 3) *
              0x3333333333333333 == 0) {
            std::
            _Rb_tree<CExtPubKey,_CExtPubKey,_std::_Identity<CExtPubKey>,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>
            ::~_Rb_tree(&local_98);
            std::
            _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~_Rb_tree(&local_68);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return;
            }
          }
          else {
            pcVar18 = (char *)__cxa_allocate_exception(0x20);
            local_438._8_8_ = std::iostream_category();
            local_438[0] = '\x01';
            local_438[1] = '\0';
            local_438[2] = '\0';
            local_438[3] = '\0';
            std::ios_base::failure[abi:cxx11]::failure
                      (pcVar18,(error_code *)
                               "Outputs provided does not match the number of outputs in transaction."
                      );
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                          std::ios_base::failure[abi:cxx11]::~failure);
            }
          }
        }
        else {
          pcVar18 = (char *)__cxa_allocate_exception(0x20);
          local_438._8_8_ = std::iostream_category();
          local_438[0] = '\x01';
          local_438[1] = '\0';
          local_438[2] = '\0';
          local_438[3] = '\0';
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar18,(error_code *)
                             "Inputs provided does not match the number of inputs in transaction.");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
      }
      else {
        pcVar18 = (char *)__cxa_allocate_exception(0x20);
        local_438._8_8_ = std::iostream_category();
        local_438[0] = '\x01';
        local_438[1] = '\0';
        local_438[2] = '\0';
        local_438[3] = '\0';
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar18,(error_code *)"No unsigned transaction was provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
    }
    else {
      pcVar18 = (char *)__cxa_allocate_exception(0x20);
      local_438._8_8_ = std::iostream_category();
      local_438[0] = '\x01';
      local_438[1] = '\0';
      local_438[2] = '\0';
      local_438[3] = '\0';
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar18,(error_code *)"Separator is missing at the end of the global map");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
    }
  }
  else {
    pcVar18 = (char *)__cxa_allocate_exception(0x20);
    local_438._8_8_ = std::iostream_category();
    local_438[0] = '\x01';
    local_438[1] = '\0';
    local_438[2] = '\0';
    local_438[3] = '\0';
    std::ios_base::failure[abi:cxx11]::failure(pcVar18,(error_code *)"Invalid PSBT magic bytes");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pcVar18,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_00372201:
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Read the magic bytes
        uint8_t magic[5];
        s >> magic;
        if (!std::equal(magic, magic + 5, PSBT_MAGIC_BYTES)) {
            throw std::ios_base::failure("Invalid PSBT magic bytes");
        }

        // Used for duplicate key detection
        std::set<std::vector<unsigned char>> key_lookup;

        // Track the global xpubs we have already seen. Just for sanity checking
        std::set<CExtPubKey> global_xpubs;

        // Read global data
        bool found_sep = false;
        while(!s.empty()) {
            // Read
            std::vector<unsigned char> key;
            s >> key;

            // the key is empty if that was actually a separator byte
            // This is a special case for key lengths 0 as those are not allowed (except for separator)
            if (key.empty()) {
                found_sep = true;
                break;
            }

            // Type is compact size uint at beginning of key
            SpanReader skey{key};
            uint64_t type = ReadCompactSize(skey);

            // Do stuff based on type
            switch(type) {
                case PSBT_GLOBAL_UNSIGNED_TX:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, unsigned tx already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Global unsigned tx key is more than one byte type");
                    }
                    CMutableTransaction mtx;
                    // Set the stream to serialize with non-witness since this should always be non-witness
                    UnserializeFromVector(s, TX_NO_WITNESS(mtx));
                    tx = std::move(mtx);
                    // Make sure that all scriptSigs and scriptWitnesses are empty
                    for (const CTxIn& txin : tx->vin) {
                        if (!txin.scriptSig.empty() || !txin.scriptWitness.IsNull()) {
                            throw std::ios_base::failure("Unsigned tx does not have empty scriptSigs and scriptWitnesses.");
                        }
                    }
                    break;
                }
                case PSBT_GLOBAL_XPUB:
                {
                    if (key.size() != BIP32_EXTKEY_WITH_VERSION_SIZE + 1) {
                        throw std::ios_base::failure("Size of key was not the expected size for the type global xpub");
                    }
                    // Read in the xpub from key
                    CExtPubKey xpub;
                    xpub.DecodeWithVersion(&key.data()[1]);
                    if (!xpub.pubkey.IsFullyValid()) {
                       throw std::ios_base::failure("Invalid pubkey");
                    }
                    if (global_xpubs.count(xpub) > 0) {
                       throw std::ios_base::failure("Duplicate key, global xpub already provided");
                    }
                    global_xpubs.insert(xpub);
                    // Read in the keypath from stream
                    KeyOriginInfo keypath;
                    DeserializeHDKeypath(s, keypath);

                    // Note that we store these swapped to make searches faster.
                    // Serialization uses xpub -> keypath to enqure key uniqueness
                    if (m_xpubs.count(keypath) == 0) {
                        // Make a new set to put the xpub in
                        m_xpubs[keypath] = {xpub};
                    } else {
                        // Insert xpub into existing set
                        m_xpubs[keypath].insert(xpub);
                    }
                    break;
                }
                case PSBT_GLOBAL_VERSION:
                {
                    if (m_version) {
                        throw std::ios_base::failure("Duplicate Key, version already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Global version key is more than one byte type");
                    }
                    uint32_t v;
                    UnserializeFromVector(s, v);
                    m_version = v;
                    if (*m_version > PSBT_HIGHEST_VERSION) {
                        throw std::ios_base::failure("Unsupported version number");
                    }
                    break;
                }
                case PSBT_GLOBAL_PROPRIETARY:
                {
                    PSBTProprietary this_prop;
                    skey >> this_prop.identifier;
                    this_prop.subtype = ReadCompactSize(skey);
                    this_prop.key = key;

                    if (m_proprietary.count(this_prop) > 0) {
                        throw std::ios_base::failure("Duplicate Key, proprietary key already found");
                    }
                    s >> this_prop.value;
                    m_proprietary.insert(this_prop);
                    break;
                }
                // Unknown stuff
                default: {
                    if (unknown.count(key) > 0) {
                        throw std::ios_base::failure("Duplicate Key, key for unknown value already provided");
                    }
                    // Read in the value
                    std::vector<unsigned char> val_bytes;
                    s >> val_bytes;
                    unknown.emplace(std::move(key), std::move(val_bytes));
                }
            }
        }

        if (!found_sep) {
            throw std::ios_base::failure("Separator is missing at the end of the global map");
        }

        // Make sure that we got an unsigned tx
        if (!tx) {
            throw std::ios_base::failure("No unsigned transaction was provided");
        }

        // Read input data
        unsigned int i = 0;
        while (!s.empty() && i < tx->vin.size()) {
            PSBTInput input;
            s >> input;
            inputs.push_back(input);

            // Make sure the non-witness utxo matches the outpoint
            if (input.non_witness_utxo) {
                if (input.non_witness_utxo->GetHash() != tx->vin[i].prevout.hash) {
                    throw std::ios_base::failure("Non-witness UTXO does not match outpoint hash");
                }
                if (tx->vin[i].prevout.n >= input.non_witness_utxo->vout.size()) {
                    throw std::ios_base::failure("Input specifies output index that does not exist");
                }
            }
            ++i;
        }
        // Make sure that the number of inputs matches the number of inputs in the transaction
        if (inputs.size() != tx->vin.size()) {
            throw std::ios_base::failure("Inputs provided does not match the number of inputs in transaction.");
        }

        // Read output data
        i = 0;
        while (!s.empty() && i < tx->vout.size()) {
            PSBTOutput output;
            s >> output;
            outputs.push_back(output);
            ++i;
        }
        // Make sure that the number of outputs matches the number of outputs in the transaction
        if (outputs.size() != tx->vout.size()) {
            throw std::ios_base::failure("Outputs provided does not match the number of outputs in transaction.");
        }
    }